

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O1

void Omega_h::vtk::read_vtu_ents(istream *stream,Mesh *mesh)

{
  pointer pcVar1;
  Alloc *pAVar2;
  size_t sVar3;
  void *pvVar4;
  Comm *this;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Omega_h_Family family_in;
  mapped_type *pmVar10;
  const_iterator cVar11;
  int *piVar12;
  long lVar13;
  uint uVar14;
  undefined8 uVar15;
  LO size;
  char *pcVar16;
  Tag tag6;
  Tag tag7;
  Read<double> coords;
  Tag tag5;
  Tag tag8;
  CommPtr comm;
  Tag tag3;
  Tag tag4;
  Tag tag9;
  Tag tag2;
  Tag tag10;
  Tag tag1;
  undefined1 local_490 [32];
  anon_enum_32 local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  Alloc *local_438;
  void *pvStack_430;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_420;
  Alloc *local_418;
  void *pvStack_410;
  undefined1 local_400 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d8;
  Alloc *local_3a8;
  void *local_3a0;
  undefined1 local_398 [32];
  anon_enum_32 local_378;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_370;
  undefined1 local_338 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_310;
  Alloc *local_2d8;
  pointer pcStack_2d0;
  long local_2c8;
  GOs local_2c0;
  LOs local_2b0;
  GOs local_2a0;
  Read<double> local_290;
  GOs local_280;
  Reals local_270;
  Comm *local_260;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_258;
  Comm *local_250;
  undefined1 local_248 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  Tag local_1f0;
  undefined1 local_198 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  Tag local_138;
  Tag local_e0;
  Tag local_88;
  
  xml_lite::read_tag((Tag *)local_398,stream);
  iVar8 = std::__cxx11::string::compare((char *)local_398);
  if (iVar8 != 0) {
    fail("assertion %s failed at %s +%d\n","st.elem_name == \"VTKFile\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x175);
  }
  pcVar1 = local_490 + 0x10;
  local_490._16_4_ = 0x64616568;
  local_490[0x14] = 'e';
  local_490[0x15] = 'r';
  local_490[0x16] = '_';
  local_490[0x17] = 't';
  local_490._24_2_ = 0x7079;
  local_490[0x1a] = 'e';
  local_490._8_8_ = 0xb;
  local_490[0x1b] = '\0';
  local_490._0_8_ = pcVar1;
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_370,(key_type *)local_490);
  iVar8 = std::__cxx11::string::compare((char *)pmVar10);
  if (iVar8 != 0) {
    fail("assertion %s failed at %s +%d\n",
         "st.attribs[\"header_type\"] == Traits<std::uint64_t>::name()",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x176);
  }
  if ((pointer)local_490._0_8_ != pcVar1) {
    operator_delete((void *)local_490._0_8_,
                    CONCAT17(local_490[0x17],
                             CONCAT16(local_490[0x16],
                                      CONCAT15(local_490[0x15],
                                               CONCAT14(local_490[0x14],local_490._16_4_)))) + 1);
  }
  local_490._16_4_ = 0x65747962;
  local_490[0x14] = '_';
  local_490[0x15] = 'o';
  local_490[0x16] = 'r';
  local_490[0x17] = 'd';
  local_490._24_2_ = 0x7265;
  local_490._8_8_ = 10;
  local_490[0x1a] = '\0';
  local_490._0_8_ = pcVar1;
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_370,(key_type *)local_490);
  iVar8 = std::__cxx11::string::compare((char *)pmVar10);
  if ((pointer)local_490._0_8_ != pcVar1) {
    operator_delete((void *)local_490._0_8_,
                    CONCAT17(local_490[0x17],
                             CONCAT16(local_490[0x16],
                                      CONCAT15(local_490[0x15],
                                               CONCAT14(local_490[0x14],local_490._16_4_)))) + 1);
  }
  bVar5 = is_little_endian_cpu();
  pcVar1 = local_490 + 0x10;
  local_490._16_4_ = 0x706d6f63;
  local_490[0x14] = 'r';
  local_490[0x15] = 'e';
  local_490[0x16] = 's';
  local_490[0x17] = 's';
  local_490._24_2_ = 0x726f;
  local_490._8_8_ = 10;
  local_490[0x1a] = '\0';
  local_490._0_8_ = pcVar1;
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_370,(key_type *)local_490);
  if ((pointer)local_490._0_8_ != pcVar1) {
    operator_delete((void *)local_490._0_8_,
                    CONCAT17(local_490[0x17],
                             CONCAT16(local_490[0x16],
                                      CONCAT15(local_490[0x15],
                                               CONCAT14(local_490[0x14],local_490._16_4_)))) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_370);
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
  }
  xml_lite::read_tag(&local_88,stream);
  iVar9 = std::__cxx11::string::compare((char *)&local_88);
  if (iVar9 != 0) {
    fail("assertion %s failed at %s +%d\n","tag1.elem_name == \"UnstructuredGrid\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x299);
  }
  xml_lite::read_tag((Tag *)local_398,stream);
  iVar9 = std::__cxx11::string::compare(local_398);
  if (iVar9 != 0) {
    fail("assertion %s failed at %s +%d\n","st.elem_name == \"Piece\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x186);
  }
  local_490._16_4_ = 0x626d754e;
  local_490[0x14] = 'e';
  local_490[0x15] = 'r';
  local_490[0x16] = 'O';
  local_490[0x17] = 'f';
  local_490._24_2_ = 0x6f50;
  local_490[0x1a] = 'i';
  local_490[0x1b] = 'n';
  local_490[0x1c] = 't';
  local_490[0x1d] = 's';
  local_490._8_8_ = 0xe;
  local_490[0x1e] = '\0';
  local_490._0_8_ = pcVar1;
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_370,(key_type *)local_490);
  pcVar16 = (pmVar10->_M_dataplus)._M_p;
  piVar12 = __errno_location();
  iVar9 = *piVar12;
  *piVar12 = 0;
  lVar13 = strtol(pcVar16,(char **)&local_138,10);
  if (local_138.elem_name._M_dataplus._M_p == pcVar16) {
    std::__throw_invalid_argument("stoi");
LAB_0042388c:
    std::__throw_out_of_range("stoi");
LAB_00423898:
    std::__throw_invalid_argument("stoi");
  }
  else {
    if (((int)lVar13 != lVar13) || (*piVar12 == 0x22)) goto LAB_0042388c;
    if (*piVar12 == 0) {
      *piVar12 = iVar9;
    }
    local_2c8 = lVar13;
    if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
      operator_delete((void *)local_490._0_8_,
                      CONCAT17(local_490[0x17],
                               CONCAT16(local_490[0x16],
                                        CONCAT15(local_490[0x15],
                                                 CONCAT14(local_490[0x14],local_490._16_4_)))) + 1);
    }
    local_490._16_4_ = 0x626d754e;
    local_490[0x14] = 'e';
    local_490[0x15] = 'r';
    local_490[0x16] = 'O';
    local_490[0x17] = 'f';
    local_490._24_2_ = 0x6543;
    local_490[0x1a] = 'l';
    local_490[0x1b] = 'l';
    local_490[0x1c] = 's';
    local_490._8_8_ = 0xd;
    local_490[0x1d] = '\0';
    local_490._0_8_ = local_490 + 0x10;
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_370,(key_type *)local_490);
    pcVar16 = (pmVar10->_M_dataplus)._M_p;
    local_420 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_420._4_4_,*piVar12);
    *piVar12 = 0;
    lVar13 = strtol(pcVar16,(char **)&local_138,10);
    if (local_138.elem_name._M_dataplus._M_p == pcVar16) goto LAB_00423898;
    if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar12 != 0x22)) {
      pcVar1 = local_490 + 0x10;
      if (*piVar12 == 0) {
        *piVar12 = (int)local_420;
      }
      if ((pointer)local_490._0_8_ != pcVar1) {
        operator_delete((void *)local_490._0_8_,
                        CONCAT17(local_490[0x17],
                                 CONCAT16(local_490[0x16],
                                          CONCAT15(local_490[0x15],
                                                   CONCAT14(local_490[0x14],local_490._16_4_)))) + 1
                       );
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_370);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      }
      xml_lite::read_tag(&local_138,stream);
      iVar9 = std::__cxx11::string::compare((char *)&local_138);
      if (iVar9 == 0) {
        Omega_h::Mesh::comm(mesh);
        local_2d8 = (Alloc *)0x0;
        pcStack_2d0 = (pointer)0x0;
        if (local_258 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_258->_M_use_count = local_258->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_258->_M_use_count = local_258->_M_use_count + 1;
          }
        }
        local_1f0.elem_name._M_dataplus._M_p = (pointer)&local_1f0.elem_name.field_2;
        local_1f0.elem_name.field_2._M_allocated_capacity._0_4_ = 0x65707974;
        local_1f0.elem_name.field_2._M_allocated_capacity._4_2_ = 0x73;
        local_1f0.elem_name._M_string_length = 5;
        local_420 = local_258;
        xml_lite::read_tag((Tag *)local_398,stream);
        iVar9 = std::__cxx11::string::compare(local_398);
        if (iVar9 == 0) {
          if (local_378 == START) {
            local_490._16_4_ = 0x656d614e;
            local_490._8_8_ = 4;
            local_490[0x14] = '\0';
            local_490._0_8_ = pcVar1;
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_370,(key_type *)local_490);
            sVar3 = pmVar10->_M_string_length;
            if (sVar3 != local_1f0.elem_name._M_string_length) {
LAB_00423767:
              fail("assertion %s failed at %s +%d\n","st.attribs[\"Name\"] == name",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                   ,0x148);
            }
            if (sVar3 != 0) {
              iVar9 = bcmp((pmVar10->_M_dataplus)._M_p,local_1f0.elem_name._M_dataplus._M_p,sVar3);
              if (iVar9 != 0) goto LAB_00423767;
            }
            if ((pointer)local_490._0_8_ != pcVar1) {
              operator_delete((void *)local_490._0_8_,
                              CONCAT17(local_490[0x17],
                                       CONCAT16(local_490[0x16],
                                                CONCAT15(local_490[0x15],
                                                         CONCAT14(local_490[0x14],local_490._16_4_))
                                               )) + 1);
            }
            local_490._16_4_ = 0x65707974;
            local_490._8_8_ = 4;
            local_490[0x14] = '\0';
            local_490._0_8_ = pcVar1;
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_370,(key_type *)local_490);
            iVar9 = std::__cxx11::string::compare((char *)pmVar10);
            if (iVar9 != 0) {
              fail("assertion %s failed at %s +%d\n","st.attribs[\"type\"] == Traits<T>::name()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                   ,0x149);
            }
            if ((pointer)local_490._0_8_ != pcVar1) {
              operator_delete((void *)local_490._0_8_,
                              CONCAT17(local_490[0x17],
                                       CONCAT16(local_490[0x16],
                                                CONCAT15(local_490[0x15],
                                                         CONCAT14(local_490[0x14],local_490._16_4_))
                                               )) + 1);
            }
            local_250 = local_260;
            local_248._0_8_ = (pointer)0x12;
            local_490._0_8_ = pcVar1;
            local_490._0_8_ = std::__cxx11::string::_M_create((ulong *)local_490,(ulong)local_248);
            local_490._16_4_ = (undefined4)local_248._0_8_;
            local_490[0x14] = SUB81(local_248._0_8_,4);
            local_490[0x15] = SUB81(local_248._0_8_,5);
            local_490[0x16] = SUB81(local_248._0_8_,6);
            local_490[0x17] = SUB81(local_248._0_8_,7);
            ((Alloc *)local_490._0_8_)->size = 0x664f7265626d754e;
            (((Alloc *)local_490._0_8_)->name)._M_dataplus._M_p = (pointer)0x6e656e6f706d6f43;
            *(undefined2 *)&(((Alloc *)local_490._0_8_)->name)._M_string_length = 0x7374;
            local_490._8_8_ = local_248._0_8_;
            *(char *)(local_248._0_8_ + (long)&((Alloc *)local_490._0_8_)->size) = '\0';
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_370,(key_type *)local_490);
            local_248._0_8_ = local_248 + 0x10;
            std::__cxx11::string::_M_construct((ulong)local_248,'\x01');
            *(char *)local_248._0_8_ = '1';
            sVar3 = pmVar10->_M_string_length;
            if (sVar3 != local_248._8_8_) {
LAB_00423788:
              fail("assertion %s failed at %s +%d\n",
                   "st.attribs[\"NumberOfComponents\"] == std::to_string(ncomps)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                   ,0x14a);
            }
            if (sVar3 != 0) {
              iVar9 = bcmp((pmVar10->_M_dataplus)._M_p,(void *)local_248._0_8_,sVar3);
              if (iVar9 != 0) goto LAB_00423788;
            }
            if ((Alloc *)local_248._0_8_ != (Alloc *)(local_248 + 0x10)) {
              operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
            }
            bVar5 = (iVar8 == 0) != bVar5;
            if ((Alloc *)local_490._0_8_ != (Alloc *)(local_490 + 0x10)) {
              operator_delete((void *)local_490._0_8_,
                              CONCAT17(local_490[0x17],
                                       CONCAT16(local_490[0x16],
                                                CONCAT15(local_490[0x15],
                                                         CONCAT14(local_490[0x14],local_490._16_4_))
                                               )) + 1);
            }
            size = (LO)lVar13;
            read_array<signed_char>
                      ((vtk *)local_400,stream,size,bVar5,
                       (_Rb_tree_header *)cVar11._M_node != &local_370._M_impl.super__Rb_tree_header
                      );
            xml_lite::read_tag((Tag *)local_490,stream);
            iVar8 = std::__cxx11::string::compare(local_490);
            if (iVar8 == 0) {
              if (local_470 == END) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_468);
                if ((Alloc *)local_490._0_8_ != (Alloc *)(local_490 + 0x10)) {
                  operator_delete((void *)local_490._0_8_,
                                  CONCAT17(local_490[0x17],
                                           CONCAT16(local_490[0x16],
                                                    CONCAT15(local_490[0x15],
                                                             CONCAT14(local_490[0x14],
                                                                      local_490._16_4_)))) + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_370);
                if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                  operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0.elem_name._M_dataplus._M_p != &local_1f0.elem_name.field_2) {
                  operator_delete(local_1f0.elem_name._M_dataplus._M_p,
                                  CONCAT26(local_1f0.elem_name.field_2._M_allocated_capacity._6_2_,
                                           CONCAT24(local_1f0.elem_name.field_2.
                                                    _M_allocated_capacity._4_2_,
                                                    local_1f0.elem_name.field_2.
                                                    _M_allocated_capacity._0_4_)) + 1);
                }
                if ((local_400._0_8_ & 1) == 0) {
                  iVar8 = *(int *)local_400._0_8_;
                }
                else {
                  iVar8 = (int)((ulong)local_400._0_8_ >> 3);
                }
                if (iVar8 == 0) {
                  iVar9 = -1;
                  iVar8 = 0;
                }
                else {
                  bVar6 = Read<signed_char>::get((Read<signed_char> *)local_400,0);
                  uVar14 = bVar6 - 3;
                  if ((9 < (byte)uVar14) || ((0x2c5U >> (uVar14 & 0x1f) & 1) == 0)) {
                    fail("Unexpected VTK type %d\n",(ulong)(uint)(int)(char)bVar6);
                  }
                  uVar14 = (uVar14 & 0xff) << 2;
                  iVar8 = *(int *)(&DAT_0045b85c + uVar14);
                  iVar9 = *(int *)(&DAT_0045b884 + uVar14);
                }
                this = local_250;
                family_in = Comm::allreduce<int>(local_250,iVar8,OMEGA_H_MAX);
                uVar14 = Comm::allreduce<int>(this,iVar9,OMEGA_H_MAX);
                if (family_in == OMEGA_H_SIMPLEX) {
                  iVar8 = -1;
                  if (uVar14 < 4) {
                    iVar8 = uVar14 + 1;
                  }
                }
                else {
                  iVar8 = -1;
                  if (uVar14 < 4) {
                    iVar8 = *(int *)(&DAT_0044eba8 + (ulong)uVar14 * 4);
                  }
                }
                local_398._16_8_ = 0x697463656e6e6f63;
                local_398._24_4_ = 0x79746976;
                local_398._8_8_ = 0xc;
                local_398[0x1c] = '\0';
                local_398._0_8_ = local_398 + 0x10;
                read_known_array<int>
                          ((istream *)local_490,(string *)stream,(LO)local_398,iVar8 * size,bVar5,
                           (_Rb_tree_header *)cVar11._M_node !=
                           &local_370._M_impl.super__Rb_tree_header);
                if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                  operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
                }
                pAVar2 = local_2d8;
                if (((ulong)local_2d8 & 7) == 0 && local_2d8 != (Alloc *)0x0) {
                  piVar12 = &local_2d8->use_count;
                  *piVar12 = *piVar12 + -1;
                  if (*piVar12 == 0) {
                    Alloc::~Alloc(local_2d8);
                    operator_delete(pAVar2,0x48);
                  }
                }
                local_2d8 = (Alloc *)local_490._0_8_;
                local_398._0_8_ = local_398 + 0x10;
                if ((local_490._0_8_ & 7) == 0 && (Alloc *)local_490._0_8_ != (Alloc *)0x0) {
                  if (entering_parallel == '\x01') {
                    local_2d8 = (Alloc *)(*(long *)local_490._0_8_ * 8 + 1);
                  }
                  else {
                    *(int *)(local_490._0_8_ + 0x30) = *(int *)(local_490._0_8_ + 0x30) + 1;
                  }
                }
                pcStack_2d0 = (pointer)local_490._8_8_;
                local_398._8_8_ = (void *)0x7;
                local_398._16_8_ = 0x7374657366666f;
                read_known_array<int>
                          ((istream *)local_248,(string *)stream,(LO)local_398,size,bVar5,
                           (_Rb_tree_header *)cVar11._M_node !=
                           &local_370._M_impl.super__Rb_tree_header);
                uVar15 = local_248._0_8_;
                if ((local_248._0_8_ & 7) == 0 && (Alloc *)local_248._0_8_ != (Alloc *)0x0) {
                  piVar12 = (int *)(local_248._0_8_ + 0x30);
                  *piVar12 = *piVar12 + -1;
                  if (*piVar12 == 0) {
                    Alloc::~Alloc((Alloc *)local_248._0_8_);
                    operator_delete((void *)uVar15,0x48);
                  }
                }
                if ((Alloc *)local_398._0_8_ != (Alloc *)(local_398 + 0x10)) {
                  operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
                }
                uVar15 = local_490._0_8_;
                if ((local_490._0_8_ & 7) == 0 && (Alloc *)local_490._0_8_ != (Alloc *)0x0) {
                  piVar12 = (int *)(local_490._0_8_ + 0x30);
                  *piVar12 = *piVar12 + -1;
                  if (*piVar12 == 0) {
                    Alloc::~Alloc((Alloc *)local_490._0_8_);
                    operator_delete((void *)uVar15,0x48);
                  }
                }
                if ((local_400._0_8_ & 7) == 0 && (Alloc *)local_400._0_8_ != (Alloc *)0x0) {
                  piVar12 = (int *)(local_400._0_8_ + 0x30);
                  *piVar12 = *piVar12 + -1;
                  if (*piVar12 == 0) {
                    Alloc::~Alloc((Alloc *)local_400._0_8_);
                    operator_delete((void *)local_400._0_8_,0x48);
                  }
                }
                if (local_420 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_420);
                }
                Omega_h::Mesh::set_family(mesh,family_in);
                Omega_h::Mesh::set_dim(mesh,uVar14);
                xml_lite::read_tag((Tag *)local_248,stream);
                iVar8 = std::__cxx11::string::compare(local_248);
                if (iVar8 != 0) {
                  fail("assertion %s failed at %s +%d\n","tag3.elem_name == \"Cells\"",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                       ,0x2a7);
                }
                xml_lite::read_tag(&local_1f0,stream);
                iVar8 = std::__cxx11::string::compare((char *)&local_1f0);
                if (iVar8 != 0) {
                  fail("assertion %s failed at %s +%d\n","tag4.elem_name == \"Points\"",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                       ,0x2a9);
                }
                local_338._0_8_ = local_338 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_338,"coordinates","");
                xml_lite::read_tag((Tag *)local_398,stream);
                iVar8 = std::__cxx11::string::compare(local_398);
                if (iVar8 == 0) {
                  if (local_378 == START) {
                    local_490._0_8_ = local_490 + 0x10;
                    local_490._16_4_ = 0x656d614e;
                    local_490._8_8_ = 4;
                    local_490[0x14] = '\0';
                    pmVar10 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&local_370,(key_type *)local_490);
                    pvVar4 = (void *)pmVar10->_M_string_length;
                    if (pvVar4 != (void *)local_338._8_8_) {
LAB_004237a9:
                      fail("assertion %s failed at %s +%d\n","st.attribs[\"Name\"] == name",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                           ,0x148);
                    }
                    if (pvVar4 != (void *)0x0) {
                      iVar8 = bcmp((pmVar10->_M_dataplus)._M_p,(void *)local_338._0_8_,
                                   (size_t)pvVar4);
                      if (iVar8 != 0) goto LAB_004237a9;
                    }
                    if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
                      operator_delete((void *)local_490._0_8_,
                                      CONCAT17(local_490[0x17],
                                               CONCAT16(local_490[0x16],
                                                        CONCAT15(local_490[0x15],
                                                                 CONCAT14(local_490[0x14],
                                                                          local_490._16_4_)))) + 1);
                    }
                    local_490._0_8_ = local_490 + 0x10;
                    local_490._16_4_ = 0x65707974;
                    local_490._8_8_ = 4;
                    local_490[0x14] = '\0';
                    pmVar10 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&local_370,(key_type *)local_490);
                    iVar8 = std::__cxx11::string::compare((char *)pmVar10);
                    if (iVar8 != 0) {
                      fail("assertion %s failed at %s +%d\n",
                           "st.attribs[\"type\"] == Traits<T>::name()",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                           ,0x149);
                    }
                    if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
                      operator_delete((void *)local_490._0_8_,
                                      CONCAT17(local_490[0x17],
                                               CONCAT16(local_490[0x16],
                                                        CONCAT15(local_490[0x15],
                                                                 CONCAT14(local_490[0x14],
                                                                          local_490._16_4_)))) + 1);
                    }
                    local_490._0_8_ = local_490 + 0x10;
                    local_400._0_8_ = (Alloc *)0x12;
                    local_490._0_8_ =
                         std::__cxx11::string::_M_create((ulong *)local_490,(ulong)local_400);
                    local_490._16_4_ = (undefined4)local_400._0_8_;
                    local_490[0x14] = SUB81(local_400._0_8_,4);
                    local_490[0x15] = SUB81(local_400._0_8_,5);
                    local_490[0x16] = SUB81(local_400._0_8_,6);
                    local_490[0x17] = SUB81(local_400._0_8_,7);
                    builtin_strncpy((char *)local_490._0_8_,"NumberOfComponents",0x12);
                    local_490._8_8_ = local_400._0_8_;
                    *(char *)(local_490._0_8_ + local_400._0_8_) = '\0';
                    pmVar10 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&local_370,(key_type *)local_490);
                    local_400._0_8_ = local_400 + 0x10;
                    std::__cxx11::string::_M_construct((ulong)local_400,'\x01');
                    *(char *)local_400._0_8_ = '3';
                    pvVar4 = (void *)pmVar10->_M_string_length;
                    if (pvVar4 == (void *)local_400._8_8_) {
                      if (pvVar4 != (void *)0x0) {
                        iVar8 = bcmp((pmVar10->_M_dataplus)._M_p,(void *)local_400._0_8_,
                                     (size_t)pvVar4);
                        if (iVar8 != 0) goto LAB_004237ca;
                      }
                      if ((Alloc *)local_400._0_8_ != (Alloc *)(local_400 + 0x10)) {
                        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
                      }
                      if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
                        operator_delete((void *)local_490._0_8_,
                                        CONCAT17(local_490[0x17],
                                                 CONCAT16(local_490[0x16],
                                                          CONCAT15(local_490[0x15],
                                                                   CONCAT14(local_490[0x14],
                                                                            local_490._16_4_)))) + 1
                                       );
                      }
                      read_array<double>((vtk *)&local_3a8,stream,(int)local_2c8 * 3,bVar5,
                                         (_Rb_tree_header *)cVar11._M_node !=
                                         &local_370._M_impl.super__Rb_tree_header);
                      xml_lite::read_tag((Tag *)local_490,stream);
                      iVar8 = std::__cxx11::string::compare(local_490);
                      if (iVar8 == 0) {
                        if (local_470 == END) {
                          std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::~_Rb_tree(&local_468);
                          if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
                            operator_delete((void *)local_490._0_8_,
                                            CONCAT17(local_490[0x17],
                                                     CONCAT16(local_490[0x16],
                                                              CONCAT15(local_490[0x15],
                                                                       CONCAT14(local_490[0x14],
                                                                                local_490._16_4_))))
                                            + 1);
                          }
                          std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::~_Rb_tree(&local_370);
                          if ((Alloc *)local_398._0_8_ != (Alloc *)(local_398 + 0x10)) {
                            operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
                          }
                          if ((Alloc *)local_338._0_8_ != (Alloc *)(local_338 + 0x10)) {
                            operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                          }
                          if ((int)uVar14 < 3) {
                            local_270.write_.shared_alloc_.alloc = local_3a8;
                            if (((ulong)local_3a8 & 7) == 0 && local_3a8 != (Alloc *)0x0) {
                              if (entering_parallel == '\x01') {
                                local_270.write_.shared_alloc_.alloc =
                                     (Alloc *)(local_3a8->size * 8 + 1);
                              }
                              else {
                                local_3a8->use_count = local_3a8->use_count + 1;
                              }
                            }
                            local_270.write_.shared_alloc_.direct_ptr = local_3a0;
                            resize_vectors((Omega_h *)local_398,&local_270,3,uVar14);
                            if (((ulong)local_3a8 & 7) == 0 && local_3a8 != (Alloc *)0x0) {
                              piVar12 = &local_3a8->use_count;
                              *piVar12 = *piVar12 + -1;
                              if (*piVar12 == 0) {
                                Alloc::~Alloc(local_3a8);
                                operator_delete(local_3a8,0x48);
                              }
                            }
                            local_3a8 = (Alloc *)local_398._0_8_;
                            local_3a0 = (void *)local_398._8_8_;
                            if (((local_398._0_8_ & 7) == 0 &&
                                 (Alloc *)local_398._0_8_ != (Alloc *)0x0) &&
                               (entering_parallel == '\x01')) {
                              *(int *)(local_398._0_8_ + 0x30) =
                                   *(int *)(local_398._0_8_ + 0x30) + -1;
                              local_3a8 = (Alloc *)(*(long *)local_398._0_8_ * 8 + 1);
                            }
                            pAVar2 = local_270.write_.shared_alloc_.alloc;
                            local_398._0_8_ = (Alloc *)0x0;
                            local_398._8_8_ = (void *)0x0;
                            if (((ulong)local_270.write_.shared_alloc_.alloc & 7) == 0 &&
                                local_270.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                              piVar12 = &(local_270.write_.shared_alloc_.alloc)->use_count;
                              *piVar12 = *piVar12 + -1;
                              if (*piVar12 == 0) {
                                Alloc::~Alloc(local_270.write_.shared_alloc_.alloc);
                                operator_delete(pAVar2,0x48);
                              }
                            }
                          }
                          xml_lite::read_tag((Tag *)local_398,stream);
                          iVar8 = std::__cxx11::string::compare(local_398);
                          if (iVar8 != 0) {
                            fail("assertion %s failed at %s +%d\n","tag5.elem_name == \"Points\"",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                                 ,0x2ae);
                          }
                          xml_lite::read_tag((Tag *)local_490,stream);
                          iVar8 = std::__cxx11::string::compare(local_490);
                          if (iVar8 != 0) {
                            fail("assertion %s failed at %s +%d\n","tag6.elem_name == \"PointData\""
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                                 ,0x2b0);
                          }
                          local_438 = (Alloc *)0x0;
                          pvStack_430 = (void *)0x0;
                          bVar7 = Omega_h::Mesh::could_be_shared(mesh,0);
                          if (bVar7) {
                            local_400._0_8_ = local_400 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_400,"global","");
                            read_known_array<long>
                                      ((istream *)local_338,(string *)stream,(LO)local_400,
                                       (Int)local_2c8,bVar5,
                                       (_Rb_tree_header *)cVar11._M_node !=
                                       &local_370._M_impl.super__Rb_tree_header);
                          }
                          else {
                            local_400._0_8_ = local_400 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"");
                            Read<long>::Read((Read<long> *)local_338,(LO)local_2c8,0,1,
                                             (string *)local_400);
                          }
                          pAVar2 = local_438;
                          if (((ulong)local_438 & 7) == 0 && local_438 != (Alloc *)0x0) {
                            piVar12 = &local_438->use_count;
                            *piVar12 = *piVar12 + -1;
                            if (*piVar12 == 0) {
                              Alloc::~Alloc(local_438);
                              operator_delete(pAVar2,0x48);
                            }
                          }
                          local_438 = (Alloc *)local_338._0_8_;
                          pvStack_430 = (void *)local_338._8_8_;
                          if (((local_338._0_8_ & 7) == 0 &&
                               (Alloc *)local_338._0_8_ != (Alloc *)0x0) &&
                             (entering_parallel == '\x01')) {
                            *(int *)(local_338._0_8_ + 0x30) = *(int *)(local_338._0_8_ + 0x30) + -1
                            ;
                            local_438 = (Alloc *)(*(long *)local_338._0_8_ * 8 + 1);
                          }
                          local_338._0_8_ = (Alloc *)0x0;
                          local_338._8_8_ = (void *)0x0;
                          if ((Alloc *)local_400._0_8_ != (Alloc *)(local_400 + 0x10)) {
                            operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
                          }
                          local_280.write_.shared_alloc_.alloc = local_438;
                          if (((ulong)local_438 & 7) == 0 && local_438 != (Alloc *)0x0) {
                            if (entering_parallel == '\x01') {
                              local_280.write_.shared_alloc_.alloc =
                                   (Alloc *)(local_438->size * 8 + 1);
                            }
                            else {
                              local_438->use_count = local_438->use_count + 1;
                            }
                          }
                          local_280.write_.shared_alloc_.direct_ptr = pvStack_430;
                          build_verts_from_globals(mesh,&local_280);
                          pAVar2 = local_280.write_.shared_alloc_.alloc;
                          if (((ulong)local_280.write_.shared_alloc_.alloc & 7) == 0 &&
                              local_280.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                            piVar12 = &(local_280.write_.shared_alloc_.alloc)->use_count;
                            *piVar12 = *piVar12 + -1;
                            if (*piVar12 == 0) {
                              Alloc::~Alloc(pAVar2);
                              operator_delete(pAVar2,0x48);
                            }
                          }
                          local_400._0_8_ = local_400 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_400,"coordinates","");
                          local_290.write_.shared_alloc_.alloc = local_3a8;
                          if (((ulong)local_3a8 & 7) == 0 && local_3a8 != (Alloc *)0x0) {
                            if (entering_parallel == '\x01') {
                              local_290.write_.shared_alloc_.alloc =
                                   (Alloc *)(local_3a8->size * 8 + 1);
                            }
                            else {
                              local_3a8->use_count = local_3a8->use_count + 1;
                            }
                          }
                          local_290.write_.shared_alloc_.direct_ptr = local_3a0;
                          Omega_h::Mesh::add_tag<double>
                                    (mesh,0,(string *)local_400,uVar14,&local_290,true);
                          pAVar2 = local_290.write_.shared_alloc_.alloc;
                          if (((ulong)local_290.write_.shared_alloc_.alloc & 7) == 0 &&
                              local_290.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                            piVar12 = &(local_290.write_.shared_alloc_.alloc)->use_count;
                            *piVar12 = *piVar12 + -1;
                            if (*piVar12 == 0) {
                              Alloc::~Alloc(pAVar2);
                              operator_delete(pAVar2,0x48);
                            }
                          }
                          if ((Alloc *)local_400._0_8_ != (Alloc *)(local_400 + 0x10)) {
                            operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
                          }
                          do {
                            bVar7 = read_tag(stream,mesh,0,bVar5,
                                             (_Rb_tree_header *)cVar11._M_node !=
                                             &local_370._M_impl.super__Rb_tree_header);
                          } while (bVar7);
                          local_400._0_8_ = local_400 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_400,"local","");
                          Omega_h::Mesh::remove_tag(mesh,0,(string *)local_400);
                          if ((Alloc *)local_400._0_8_ != (Alloc *)(local_400 + 0x10)) {
                            operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
                          }
                          local_400._0_8_ = local_400 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_400,"owner","");
                          Omega_h::Mesh::remove_tag(mesh,0,(string *)local_400);
                          if ((Alloc *)local_400._0_8_ != (Alloc *)(local_400 + 0x10)) {
                            operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
                          }
                          xml_lite::read_tag((Tag *)local_400,stream);
                          iVar8 = std::__cxx11::string::compare(local_400);
                          if (iVar8 != 0) {
                            fail("assertion %s failed at %s +%d\n","tag7.elem_name == \"CellData\"",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                                 ,0x2bf);
                          }
                          local_418 = (Alloc *)0x0;
                          pvStack_410 = (void *)0x0;
                          bVar7 = Omega_h::Mesh::could_be_shared(mesh,uVar14);
                          if (bVar7) {
                            local_338._0_8_ = local_338 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_338,"global","");
                            read_known_array<long>
                                      ((istream *)local_198,(string *)stream,(LO)local_338,size,
                                       bVar5,(_Rb_tree_header *)cVar11._M_node !=
                                             &local_370._M_impl.super__Rb_tree_header);
                          }
                          else {
                            local_338._0_8_ = local_338 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"");
                            Read<long>::Read((Read<long> *)local_198,size,0,1,(string *)local_338);
                          }
                          pAVar2 = local_418;
                          if (((ulong)local_418 & 7) == 0 && local_418 != (Alloc *)0x0) {
                            piVar12 = &local_418->use_count;
                            *piVar12 = *piVar12 + -1;
                            if (*piVar12 == 0) {
                              Alloc::~Alloc(local_418);
                              operator_delete(pAVar2,0x48);
                            }
                          }
                          local_418 = (Alloc *)local_198._0_8_;
                          pvStack_410 = (void *)local_198._8_8_;
                          if (((local_198._0_8_ & 7) == 0 &&
                               (Alloc *)local_198._0_8_ != (Alloc *)0x0) &&
                             (entering_parallel == '\x01')) {
                            *(int *)(local_198._0_8_ + 0x30) = *(int *)(local_198._0_8_ + 0x30) + -1
                            ;
                            local_418 = (Alloc *)(*(long *)local_198._0_8_ * 8 + 1);
                          }
                          local_198._0_8_ = (Alloc *)0x0;
                          local_198._8_8_ = (void *)0x0;
                          if ((Alloc *)local_338._0_8_ != (Alloc *)(local_338 + 0x10)) {
                            operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                          }
                          local_2b0.write_.shared_alloc_.alloc = local_2d8;
                          if (((ulong)local_2d8 & 7) == 0 && local_2d8 != (Alloc *)0x0) {
                            if (entering_parallel == '\x01') {
                              local_2b0.write_.shared_alloc_.alloc =
                                   (Alloc *)(local_2d8->size * 8 + 1);
                            }
                            else {
                              local_2d8->use_count = local_2d8->use_count + 1;
                            }
                          }
                          local_2b0.write_.shared_alloc_.direct_ptr = pcStack_2d0;
                          local_2c0.write_.shared_alloc_.alloc = local_438;
                          if (((ulong)local_438 & 7) == 0 && local_438 != (Alloc *)0x0) {
                            if (entering_parallel == '\x01') {
                              local_2c0.write_.shared_alloc_.alloc =
                                   (Alloc *)(local_438->size * 8 + 1);
                            }
                            else {
                              local_438->use_count = local_438->use_count + 1;
                            }
                          }
                          local_2c0.write_.shared_alloc_.direct_ptr = pvStack_430;
                          local_2a0.write_.shared_alloc_.alloc = local_418;
                          if (((ulong)local_418 & 7) == 0 && local_418 != (Alloc *)0x0) {
                            if (entering_parallel == '\x01') {
                              local_2a0.write_.shared_alloc_.alloc =
                                   (Alloc *)(local_418->size * 8 + 1);
                            }
                            else {
                              local_418->use_count = local_418->use_count + 1;
                            }
                          }
                          local_2a0.write_.shared_alloc_.direct_ptr = pvStack_410;
                          build_ents_from_elems2verts(mesh,&local_2b0,&local_2c0,&local_2a0);
                          pAVar2 = local_2a0.write_.shared_alloc_.alloc;
                          if (((ulong)local_2a0.write_.shared_alloc_.alloc & 7) == 0 &&
                              local_2a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                            piVar12 = &(local_2a0.write_.shared_alloc_.alloc)->use_count;
                            *piVar12 = *piVar12 + -1;
                            if (*piVar12 == 0) {
                              Alloc::~Alloc(local_2a0.write_.shared_alloc_.alloc);
                              operator_delete(pAVar2,0x48);
                            }
                          }
                          pAVar2 = local_2c0.write_.shared_alloc_.alloc;
                          if (((ulong)local_2c0.write_.shared_alloc_.alloc & 7) == 0 &&
                              local_2c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                            piVar12 = &(local_2c0.write_.shared_alloc_.alloc)->use_count;
                            *piVar12 = *piVar12 + -1;
                            if (*piVar12 == 0) {
                              Alloc::~Alloc(pAVar2);
                              operator_delete(pAVar2,0x48);
                            }
                          }
                          pAVar2 = local_2b0.write_.shared_alloc_.alloc;
                          if (((ulong)local_2b0.write_.shared_alloc_.alloc & 7) == 0 &&
                              local_2b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                            piVar12 = &(local_2b0.write_.shared_alloc_.alloc)->use_count;
                            *piVar12 = *piVar12 + -1;
                            if (*piVar12 == 0) {
                              Alloc::~Alloc(local_2b0.write_.shared_alloc_.alloc);
                              operator_delete(pAVar2,0x48);
                            }
                          }
                          do {
                            bVar7 = read_tag(stream,mesh,uVar14,bVar5,
                                             (_Rb_tree_header *)cVar11._M_node !=
                                             &local_370._M_impl.super__Rb_tree_header);
                          } while (bVar7);
                          pAVar2 = (Alloc *)(local_338 + 0x10);
                          local_338._0_8_ = pAVar2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_338,"local","");
                          Omega_h::Mesh::remove_tag(mesh,uVar14,(string *)local_338);
                          if ((Alloc *)local_338._0_8_ != pAVar2) {
                            operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                          }
                          local_338._0_8_ = pAVar2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_338,"owner","");
                          Omega_h::Mesh::remove_tag(mesh,uVar14,(string *)local_338);
                          if ((Alloc *)local_338._0_8_ != pAVar2) {
                            operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                          }
                          xml_lite::read_tag((Tag *)local_338,stream);
                          iVar8 = std::__cxx11::string::compare(local_338);
                          if (iVar8 != 0) {
                            fail("assertion %s failed at %s +%d\n","tag8.elem_name == \"Piece\"",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                                 ,0x2cd);
                          }
                          xml_lite::read_tag((Tag *)local_198,stream);
                          iVar8 = std::__cxx11::string::compare(local_198);
                          if (iVar8 != 0) {
                            fail("assertion %s failed at %s +%d\n",
                                 "tag9.elem_name == \"UnstructuredGrid\"",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                                 ,0x2cf);
                          }
                          xml_lite::read_tag(&local_e0,stream);
                          iVar8 = std::__cxx11::string::compare((char *)&local_e0);
                          if (iVar8 == 0) {
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~_Rb_tree(&local_e0.attribs._M_t);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_e0.elem_name._M_dataplus._M_p !=
                                &local_e0.elem_name.field_2) {
                              operator_delete(local_e0.elem_name._M_dataplus._M_p,
                                              local_e0.elem_name.field_2._M_allocated_capacity + 1);
                            }
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~_Rb_tree(&local_170);
                            if ((Alloc *)local_198._0_8_ != (Alloc *)(local_198 + 0x10)) {
                              operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
                            }
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~_Rb_tree(&local_310);
                            if ((Alloc *)local_338._0_8_ != pAVar2) {
                              operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                            }
                            pAVar2 = local_418;
                            if (((ulong)local_418 & 7) == 0 && local_418 != (Alloc *)0x0) {
                              piVar12 = &local_418->use_count;
                              *piVar12 = *piVar12 + -1;
                              if (*piVar12 == 0) {
                                Alloc::~Alloc(local_418);
                                operator_delete(pAVar2,0x48);
                              }
                            }
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~_Rb_tree(&local_3d8);
                            if ((Alloc *)local_400._0_8_ != (Alloc *)(local_400 + 0x10)) {
                              operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
                            }
                            pAVar2 = local_438;
                            if (((ulong)local_438 & 7) == 0 && local_438 != (Alloc *)0x0) {
                              piVar12 = &local_438->use_count;
                              *piVar12 = *piVar12 + -1;
                              if (*piVar12 == 0) {
                                Alloc::~Alloc(local_438);
                                operator_delete(pAVar2,0x48);
                              }
                            }
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~_Rb_tree(&local_468);
                            if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
                              operator_delete((void *)local_490._0_8_,
                                              CONCAT17(local_490[0x17],
                                                       CONCAT16(local_490[0x16],
                                                                CONCAT15(local_490[0x15],
                                                                         CONCAT14(local_490[0x14],
                                                                                  local_490._16_4_))
                                                               )) + 1);
                            }
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~_Rb_tree(&local_370);
                            if ((Alloc *)local_398._0_8_ != (Alloc *)(local_398 + 0x10)) {
                              operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
                            }
                            pAVar2 = local_3a8;
                            if (((ulong)local_3a8 & 7) == 0 && local_3a8 != (Alloc *)0x0) {
                              piVar12 = &local_3a8->use_count;
                              *piVar12 = *piVar12 + -1;
                              if (*piVar12 == 0) {
                                Alloc::~Alloc(local_3a8);
                                operator_delete(pAVar2,0x48);
                              }
                            }
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~_Rb_tree(&local_1f0.attribs._M_t);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_1f0.elem_name._M_dataplus._M_p !=
                                &local_1f0.elem_name.field_2) {
                              operator_delete(local_1f0.elem_name._M_dataplus._M_p,
                                              CONCAT26(local_1f0.elem_name.field_2.
                                                       _M_allocated_capacity._6_2_,
                                                       CONCAT24(local_1f0.elem_name.field_2.
                                                                _M_allocated_capacity._4_2_,
                                                                local_1f0.elem_name.field_2.
                                                                _M_allocated_capacity._0_4_)) + 1);
                            }
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~_Rb_tree(&local_220);
                            if ((Alloc *)local_248._0_8_ != (Alloc *)(local_248 + 0x10)) {
                              operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
                            }
                            pAVar2 = local_2d8;
                            if (((ulong)local_2d8 & 7) == 0 && local_2d8 != (Alloc *)0x0) {
                              piVar12 = &local_2d8->use_count;
                              *piVar12 = *piVar12 + -1;
                              if (*piVar12 == 0) {
                                Alloc::~Alloc(local_2d8);
                                operator_delete(pAVar2,0x48);
                              }
                            }
                            if (local_258 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_258);
                            }
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~_Rb_tree(&local_138.attribs._M_t);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_138.elem_name._M_dataplus._M_p !=
                                &local_138.elem_name.field_2) {
                              operator_delete(local_138.elem_name._M_dataplus._M_p,
                                              local_138.elem_name.field_2._M_allocated_capacity + 1)
                              ;
                            }
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~_Rb_tree(&local_88.attribs._M_t);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_88.elem_name._M_dataplus._M_p !=
                                &local_88.elem_name.field_2) {
                              operator_delete(local_88.elem_name._M_dataplus._M_p,
                                              local_88.elem_name.field_2._M_allocated_capacity + 1);
                            }
                            return;
                          }
                          fail("assertion %s failed at %s +%d\n","tag10.elem_name == \"VTKFile\"",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                               ,0x2d1);
                        }
                        uVar15 = 0x14f;
                        pcVar16 = "et.type == xml_lite::Tag::END";
                      }
                      else {
                        uVar15 = 0x14e;
                        pcVar16 = "et.elem_name == \"DataArray\"";
                      }
                      fail("assertion %s failed at %s +%d\n",pcVar16,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                           ,uVar15);
                    }
LAB_004237ca:
                    fail("assertion %s failed at %s +%d\n",
                         "st.attribs[\"NumberOfComponents\"] == std::to_string(ncomps)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                         ,0x14a);
                  }
                  uVar15 = 0x147;
                  pcVar16 = "st.type == xml_lite::Tag::START";
                }
                else {
                  uVar15 = 0x146;
                  pcVar16 = "st.elem_name == \"DataArray\"";
                }
                fail("assertion %s failed at %s +%d\n",pcVar16,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                     ,uVar15);
              }
              uVar15 = 0x14f;
              pcVar16 = "et.type == xml_lite::Tag::END";
            }
            else {
              uVar15 = 0x14e;
              pcVar16 = "et.elem_name == \"DataArray\"";
            }
            fail("assertion %s failed at %s +%d\n",pcVar16,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                 ,uVar15);
          }
          uVar15 = 0x147;
          pcVar16 = "st.type == xml_lite::Tag::START";
        }
        else {
          uVar15 = 0x146;
          pcVar16 = "st.elem_name == \"DataArray\"";
        }
        fail("assertion %s failed at %s +%d\n",pcVar16,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,uVar15);
      }
      goto LAB_004238b0;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_004238b0:
  fail("assertion %s failed at %s +%d\n","tag2.elem_name == \"Cells\"",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
       ,0x29d);
}

Assistant:

void read_vtu_ents(std::istream& stream, Mesh* mesh) {
  bool needs_swapping, is_compressed;
  read_vtkfile_vtu_start_tag(stream, &needs_swapping, &is_compressed);
  auto tag1 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag1.elem_name == "UnstructuredGrid");
  LO nverts, ncells;
  read_piece_start_tag(stream, &nverts, &ncells);
  auto tag2 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag2.elem_name == "Cells");
  auto comm = mesh->comm();
  Omega_h_Family family;
  Int dim;
  LOs ev2v;
  read_connectivity(stream, comm, ncells, needs_swapping, is_compressed,
      &family, &dim, &ev2v);
  mesh->set_family(family);
  mesh->set_dim(dim);
  auto tag3 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag3.elem_name == "Cells");
  auto tag4 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag4.elem_name == "Points");
  auto coords = read_known_array<Real>(
      stream, "coordinates", nverts, 3, needs_swapping, is_compressed);
  if (dim < 3) coords = resize_vectors(coords, 3, dim);
  auto tag5 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag5.elem_name == "Points");
  auto tag6 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag6.elem_name == "PointData");
  GOs vert_globals;
  if (mesh->could_be_shared(VERT)) {
    vert_globals = read_known_array<GO>(
        stream, "global", nverts, 1, needs_swapping, is_compressed);
  } else {
    vert_globals = Read<GO>(nverts, 0, 1);
  }
  build_verts_from_globals(mesh, vert_globals);
  mesh->add_tag(VERT, "coordinates", dim, coords, true);
  while (read_tag(stream, mesh, VERT, needs_swapping, is_compressed))
    ;
  mesh->remove_tag(VERT, "local");
  mesh->remove_tag(VERT, "owner");
  auto tag7 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag7.elem_name == "CellData");
  GOs elem_globals;
  if (mesh->could_be_shared(dim)) {
    elem_globals = read_known_array<GO>(
        stream, "global", ncells, 1, needs_swapping, is_compressed);
  } else {
    elem_globals = Read<GO>(ncells, 0, 1);
  }
  build_ents_from_elems2verts(mesh, ev2v, vert_globals, elem_globals);
  while (read_tag(stream, mesh, dim, needs_swapping, is_compressed))
    ;
  mesh->remove_tag(dim, "local");
  mesh->remove_tag(dim, "owner");
  auto tag8 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag8.elem_name == "Piece");
  auto tag9 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag9.elem_name == "UnstructuredGrid");
  auto tag10 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag10.elem_name == "VTKFile");
}